

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool __thiscall wallet::MockableBatch::HasKey(MockableBatch *this,DataStream *key)

{
  long lVar1;
  iterator __last;
  size_type sVar2;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_RSI;
  allocator_type *in_RDI;
  long in_FS_OFFSET;
  SerializeData key_data;
  DataStream *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_stack_ffffffffffffffa8;
  bool local_22;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)in_RDI[0x10] & 1) == 0) {
    local_22 = false;
  }
  else {
    __last = DataStream::begin((DataStream *)
                               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    DataStream::end(in_stack_ffffffffffffff80);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
    vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
              (in_stack_ffffffffffffffa8,in_RSI,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                )__last._M_current,in_RDI);
    sVar2 = std::
            map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
            ::count((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                    &in_stack_ffffffffffffff80->vch);
    local_22 = sVar2 != 0;
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
              ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_22;
  }
  __stack_chk_fail();
}

Assistant:

bool MockableBatch::HasKey(DataStream&& key)
{
    if (!m_pass) {
        return false;
    }
    SerializeData key_data{key.begin(), key.end()};
    return m_records.count(key_data) > 0;
}